

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O1

csc * form_KKT(csc *P,csc *A,c_int format,c_float param1,c_float *param2,c_int *PtoKKT,c_int *AtoKKT
              ,c_int **Pdiag_idx,c_int *Pdiag_n,c_int *param2toKKT)

{
  long lVar1;
  long lVar2;
  double dVar3;
  c_int *pcVar4;
  c_float *pcVar5;
  c_int *pcVar6;
  c_int *pcVar7;
  c_float *pcVar8;
  csc *T;
  c_int *pcVar9;
  csc *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  lVar12 = A->m + P->m;
  T = csc_spalloc(lVar12,lVar12,P->p[P->n] + lVar12 + A->p[A->n],1,1);
  if (T == (csc *)0x0) {
LAB_0010a2d9:
    pcVar10 = (csc *)0x0;
  }
  else {
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar9 = (c_int *)malloc(P->m << 3);
      *Pdiag_idx = pcVar9;
      *Pdiag_n = 0;
    }
    if (P->n < 1) {
      lVar12 = 0;
    }
    else {
      pcVar9 = P->p;
      lVar12 = 0;
      lVar11 = 0;
      do {
        if (pcVar9[lVar11] == pcVar9[lVar11 + 1]) {
          T->i[lVar12] = lVar11;
          T->p[lVar12] = lVar11;
          T->x[lVar12] = param1;
          lVar12 = lVar12 + 1;
        }
        lVar1 = lVar11 + 1;
        lVar13 = pcVar9[lVar11];
        if (lVar13 < pcVar9[lVar1]) {
          pcVar4 = P->i;
          pcVar5 = P->x;
          pcVar6 = T->p;
          pcVar7 = T->i;
          pcVar8 = T->x;
          do {
            lVar14 = pcVar4[lVar13];
            pcVar7[lVar12] = lVar14;
            pcVar6[lVar12] = lVar11;
            dVar3 = pcVar5[lVar13];
            pcVar8[lVar12] = dVar3;
            if (PtoKKT != (c_int *)0x0) {
              PtoKKT[lVar13] = lVar12;
            }
            if ((lVar14 == lVar11) && (pcVar8[lVar12] = dVar3 + param1, Pdiag_idx != (c_int **)0x0))
            {
              (*Pdiag_idx)[*Pdiag_n] = lVar13;
              *Pdiag_n = *Pdiag_n + 1;
            }
            lVar2 = lVar12 + 1;
            if ((lVar14 < lVar11) && (lVar13 + 1 == pcVar9[lVar1])) {
              pcVar7[lVar12 + 1] = lVar11;
              pcVar6[lVar12 + 1] = lVar11;
              pcVar8[lVar12 + 1] = param1;
              lVar2 = lVar12 + 2;
            }
            lVar12 = lVar2;
            lVar13 = lVar13 + 1;
          } while (lVar13 < pcVar9[lVar1]);
        }
        lVar11 = lVar1;
      } while (lVar1 < P->n);
    }
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar9 = (c_int *)realloc(*Pdiag_idx,*Pdiag_n << 3);
      *Pdiag_idx = pcVar9;
    }
    if (0 < A->n) {
      pcVar9 = A->p;
      lVar11 = 0;
      do {
        lVar1 = pcVar9[lVar11];
        lVar13 = lVar11 + 1;
        if (lVar1 < pcVar9[lVar11 + 1]) {
          pcVar4 = T->p;
          pcVar6 = T->i;
          pcVar5 = T->x;
          pcVar8 = A->x;
          pcVar7 = A->i;
          lVar14 = 0;
          do {
            pcVar4[lVar12 + lVar14] = pcVar7[lVar1 + lVar14] + P->m;
            pcVar6[lVar12 + lVar14] = lVar11;
            pcVar5[lVar12 + lVar14] = pcVar8[lVar1 + lVar14];
            if (AtoKKT != (c_int *)0x0) {
              AtoKKT[lVar1 + lVar14] = lVar14 + lVar12;
            }
            lVar2 = lVar1 + lVar14;
            lVar14 = lVar14 + 1;
          } while (lVar2 + 1 < pcVar9[lVar13]);
          lVar12 = lVar12 + lVar14;
        }
        lVar11 = lVar13;
      } while (lVar13 < A->n);
    }
    if (0 < A->m) {
      pcVar9 = T->i;
      pcVar4 = T->p;
      pcVar5 = T->x;
      lVar11 = 0;
      do {
        pcVar9[lVar12 + lVar11] = P->n + lVar11;
        pcVar4[lVar12 + lVar11] = P->n + lVar11;
        pcVar5[lVar12 + lVar11] = -param2[lVar11];
        if (param2toKKT != (c_int *)0x0) {
          param2toKKT[lVar11] = lVar11 + lVar12;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < A->m);
      lVar12 = lVar12 + lVar11;
    }
    T->nz = lVar12;
    if ((PtoKKT == (c_int *)0x0 && AtoKKT == (c_int *)0x0) && param2toKKT == (c_int *)0x0) {
      if (format == 0) {
        pcVar10 = triplet_to_csc(T,(c_int *)0x0);
      }
      else {
        pcVar10 = triplet_to_csr(T,(c_int *)0x0);
      }
    }
    else {
      pcVar9 = (c_int *)malloc(lVar12 << 3);
      if (pcVar9 == (c_int *)0x0) {
        csc_spfree(T);
        free(*Pdiag_idx);
        goto LAB_0010a2d9;
      }
      if (format == 0) {
        pcVar10 = triplet_to_csc(T,pcVar9);
      }
      else {
        pcVar10 = triplet_to_csr(T,pcVar9);
      }
      if ((PtoKKT != (c_int *)0x0) && (pcVar4 = P->p, 0 < pcVar4[P->n])) {
        lVar12 = 0;
        do {
          PtoKKT[lVar12] = pcVar9[PtoKKT[lVar12]];
          lVar12 = lVar12 + 1;
        } while (lVar12 < pcVar4[P->n]);
      }
      if ((AtoKKT != (c_int *)0x0) && (pcVar4 = A->p, 0 < pcVar4[A->n])) {
        lVar12 = 0;
        do {
          AtoKKT[lVar12] = pcVar9[AtoKKT[lVar12]];
          lVar12 = lVar12 + 1;
        } while (lVar12 < pcVar4[A->n]);
      }
      if ((param2toKKT != (c_int *)0x0) && (0 < A->m)) {
        lVar12 = 0;
        do {
          param2toKKT[lVar12] = pcVar9[param2toKKT[lVar12]];
          lVar12 = lVar12 + 1;
        } while (lVar12 < A->m);
      }
      free(pcVar9);
    }
    csc_spfree(T);
  }
  return pcVar10;
}

Assistant:

csc* form_KKT(const csc  *P,
              const  csc *A,
              c_int       format,
              c_float     param1,
              c_float    *param2,
              c_int      *PtoKKT,
              c_int      *AtoKKT,
              c_int     **Pdiag_idx,
              c_int      *Pdiag_n,
              c_int      *param2toKKT) {
  c_int  nKKT, nnzKKTmax; // Size, number of nonzeros and max number of nonzeros
                          // in KKT matrix
  csc   *KKT_trip, *KKT;  // KKT matrix in triplet format and CSC format
  c_int  ptr, i, j;       // Counters for elements (i,j) and index pointer
  c_int  zKKT = 0;        // Counter for total number of elements in P and in
                          // KKT
  c_int *KKT_TtoC;        // Pointer to vector mapping from KKT in triplet form
                          // to CSC

  // Get matrix dimensions
  nKKT = P->m + A->m;

  // Get maximum number of nonzero elements (only upper triangular part)
  nnzKKTmax = P->p[P->n] + // Number of elements in P
              P->m +       // Number of elements in param1 * I
              A->p[A->n] + // Number of nonzeros in A
              A->m;        // Number of elements in - diag(param2)

  // Preallocate KKT matrix in triplet format
  KKT_trip = csc_spalloc(nKKT, nKKT, nnzKKTmax, 1, 1);

  if (!KKT_trip) return OSQP_NULL;  // Failed to preallocate matrix

  // Allocate vector of indices on the diagonal. Worst case it has m elements
  if (Pdiag_idx != OSQP_NULL) {
    (*Pdiag_idx) = c_malloc(P->m * sizeof(c_int));
    *Pdiag_n     = 0; // Set 0 diagonal elements to start
  }

  // Allocate Triplet matrices
  // P + param1 I
  for (j = 0; j < P->n; j++) { // cycle over columns
    // No elements in column j => add diagonal element param1
    if (P->p[j] == P->p[j + 1]) {
      KKT_trip->i[zKKT] = j;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = param1;
      zKKT++;
    }

    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // cycle over rows
      // Get current row
      i = P->i[ptr];

      // Add element of P
      KKT_trip->i[zKKT] = i;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = P->x[ptr];

      if (PtoKKT != OSQP_NULL) PtoKKT[ptr] = zKKT;  // Update index from P to
                                                    // KKTtrip

      if (i == j) {                                 // P has a diagonal element,
                                                    // add param1
        KKT_trip->x[zKKT] += param1;

        // If index vector pointer supplied -> Store the index
        if (Pdiag_idx != OSQP_NULL) {
          (*Pdiag_idx)[*Pdiag_n] = ptr;
          (*Pdiag_n)++;
        }
      }
      zKKT++;

      // Add diagonal param1 in case
      if ((i < j) &&                  // Diagonal element not reached
          (ptr + 1 == P->p[j + 1])) { // last element of column j
        // Add diagonal element param1
        KKT_trip->i[zKKT] = j;
        KKT_trip->p[zKKT] = j;
        KKT_trip->x[zKKT] = param1;
        zKKT++;
      }
    }
  }

  if (Pdiag_idx != OSQP_NULL) {
    // Realloc Pdiag_idx so that it contains exactly *Pdiag_n diagonal elements
    (*Pdiag_idx) = c_realloc((*Pdiag_idx), (*Pdiag_n) * sizeof(c_int));
  }


  // A' at top right
  for (j = 0; j < A->n; j++) {                      // Cycle over columns of A
    for (ptr = A->p[j]; ptr < A->p[j + 1]; ptr++) {
      KKT_trip->p[zKKT] = P->m + A->i[ptr];         // Assign column index from
                                                    // row index of A
      KKT_trip->i[zKKT] = j;                        // Assign row index from
                                                    // column index of A
      KKT_trip->x[zKKT] = A->x[ptr];                // Assign A value element

      if (AtoKKT != OSQP_NULL) AtoKKT[ptr] = zKKT;  // Update index from A to
                                                    // KKTtrip
      zKKT++;
    }
  }

  // - diag(param2) at bottom right
  for (j = 0; j < A->m; j++) {
    KKT_trip->i[zKKT] = j + P->n;
    KKT_trip->p[zKKT] = j + P->n;
    KKT_trip->x[zKKT] = -param2[j];

    if (param2toKKT != OSQP_NULL) param2toKKT[j] = zKKT;  // Update index from
                                                          // param2 to KKTtrip
    zKKT++;
  }

  // Allocate number of nonzeros
  KKT_trip->nz = zKKT;

  // Convert triplet matrix to csc format
  if (!PtoKKT && !AtoKKT && !param2toKKT) {
    // If no index vectors passed, do not store KKT mapping from Trip to CSC/CSR
    if (format == 0) KKT = triplet_to_csc(KKT_trip, OSQP_NULL);
    else KKT = triplet_to_csr(KKT_trip, OSQP_NULL);
  }
  else {
    // Allocate vector of indices from triplet to csc
    KKT_TtoC = c_malloc((zKKT) * sizeof(c_int));

    if (!KKT_TtoC) {
      // Error in allocating KKT_TtoC vector
      csc_spfree(KKT_trip);
      c_free(*Pdiag_idx);
      return OSQP_NULL;
    }

    // Store KKT mapping from Trip to CSC/CSR
    if (format == 0)
      KKT = triplet_to_csc(KKT_trip, KKT_TtoC);
    else
      KKT = triplet_to_csr(KKT_trip, KKT_TtoC);

    // Update vectors of indices from P, A, param2 to KKT (now in CSC format)
    if (PtoKKT != OSQP_NULL) {
      for (i = 0; i < P->p[P->n]; i++) {
        PtoKKT[i] = KKT_TtoC[PtoKKT[i]];
      }
    }

    if (AtoKKT != OSQP_NULL) {
      for (i = 0; i < A->p[A->n]; i++) {
        AtoKKT[i] = KKT_TtoC[AtoKKT[i]];
      }
    }

    if (param2toKKT != OSQP_NULL) {
      for (i = 0; i < A->m; i++) {
        param2toKKT[i] = KKT_TtoC[param2toKKT[i]];
      }
    }

    // Free mapping
    c_free(KKT_TtoC);
  }

  // Clean matrix in triplet format and return result
  csc_spfree(KKT_trip);

  return KKT;
}